

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_java_generator.cc
# Opt level: O0

string * __thiscall
t_java_generator::get_cap_name(string *__return_storage_ptr__,t_java_generator *this,string *name)

{
  int iVar1;
  char *pcVar2;
  undefined1 *puVar3;
  string local_40;
  string *local_20;
  string *name_local;
  t_java_generator *this_local;
  
  local_20 = name;
  name_local = (string *)this;
  this_local = (t_java_generator *)__return_storage_ptr__;
  if ((this->nocamel_style_ & 1U) == 0) {
    if ((this->fullcamel_style_ & 1U) == 0) {
      pcVar2 = (char *)std::__cxx11::string::operator[]((ulong)name);
      iVar1 = toupper((int)*pcVar2);
      puVar3 = (undefined1 *)std::__cxx11::string::operator[]((ulong)name);
      *puVar3 = (char)iVar1;
      std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)name);
    }
    else {
      std::__cxx11::string::string((string *)&local_40,(string *)name);
      as_camel_case(__return_storage_ptr__,this,&local_40,true);
      std::__cxx11::string::~string((string *)&local_40);
    }
  }
  else {
    std::operator+(__return_storage_ptr__,"_",name);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string t_java_generator::get_cap_name(std::string name) {
  if (nocamel_style_) {
    return "_" + name;
  } else if (fullcamel_style_) {
    return as_camel_case(name);
  } else {
    name[0] = toupper(name[0]);
    return name;
  }
}